

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

reporterMap * doctest::anon_unknown_14::getReporters(void)

{
  int iVar1;
  reporterMap *in_RAX;
  reporterMap *prVar2;
  
  if ((anonymous_namespace)::getReporters()::data == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::getReporters()::data);
    if (iVar1 != 0) {
      getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header;
      getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header;
      getReporters::data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
                   ::~map,&getReporters::data,&__dso_handle);
      prVar2 = (reporterMap *)__cxa_guard_release(&(anonymous_namespace)::getReporters()::data);
      return prVar2;
    }
  }
  return in_RAX;
}

Assistant:

reporterMap& getReporters() {
        static reporterMap data;
        return data;
    }